

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O3

btScalar __thiscall
btMLCPSolver::solveGroupCacheFriendlyIterations
          (btMLCPSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  btSolverConstraint **ppbVar11;
  btSolverBody *pbVar12;
  float *pfVar13;
  float *pfVar14;
  btSolverConstraint *pbVar15;
  btRigidBody *pbVar16;
  btRigidBody *pbVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  
  CProfileManager::Start_Profile("solveMLCP");
  iVar18 = (*(this->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
             _vptr_btConstraintSolver[0xf])(this,infoGlobal);
  CProfileManager::Stop_Profile();
  if ((char)iVar18 == '\0') {
    this->m_fallback = this->m_fallback + 1;
    btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations
              (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,manifoldPtr,
               numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
  }
  else {
    CProfileManager::Start_Profile("process MLCP results");
    lVar19 = (long)(this->m_allConstraintPtrArray).m_size;
    if (0 < lVar19) {
      ppbVar11 = (this->m_allConstraintPtrArray).m_data;
      pbVar12 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
      pfVar13 = (this->m_x).m_storage.m_data;
      iVar18 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse;
      pfVar14 = (this->m_xSplit).m_storage.m_data;
      lVar20 = 0;
      do {
        pbVar15 = ppbVar11[lVar20];
        iVar9 = pbVar15->m_solverBodyIdA;
        iVar10 = pbVar15->m_solverBodyIdB;
        fVar22 = pfVar13[lVar20];
        fVar21 = fVar22 - pbVar15->m_appliedImpulse;
        pbVar15->m_appliedImpulse = fVar22;
        pbVar16 = pbVar12[iVar9].m_originalBody;
        if (pbVar16 != (btRigidBody *)0x0) {
          fVar22 = (pbVar15->m_contactNormal1).m_floats[2];
          fVar1 = pbVar12[iVar9].m_invMass.m_floats[2];
          fVar2 = pbVar12[iVar9].m_linearFactor.m_floats[2];
          uVar3 = *(undefined8 *)(pbVar15->m_contactNormal1).m_floats;
          uVar4 = *(undefined8 *)pbVar12[iVar9].m_invMass.m_floats;
          uVar5 = *(undefined8 *)pbVar12[iVar9].m_deltaLinearVelocity.m_floats;
          uVar6 = *(undefined8 *)pbVar12[iVar9].m_deltaAngularVelocity.m_floats;
          uVar7 = *(undefined8 *)pbVar12[iVar9].m_angularFactor.m_floats;
          uVar8 = *(undefined8 *)pbVar12[iVar9].m_linearFactor.m_floats;
          *(ulong *)pbVar12[iVar9].m_deltaLinearVelocity.m_floats =
               CONCAT44((float)((ulong)uVar8 >> 0x20) *
                        (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar3 >> 0x20) * fVar21 +
                        (float)((ulong)uVar5 >> 0x20),
                        (float)uVar8 * (float)uVar4 * (float)uVar3 * fVar21 + (float)uVar5);
          pbVar12[iVar9].m_deltaLinearVelocity.m_floats[2] =
               fVar22 * fVar1 * fVar21 * fVar2 + pbVar12[iVar9].m_deltaLinearVelocity.m_floats[2];
          fVar22 = pbVar12[iVar9].m_angularFactor.m_floats[2];
          fVar1 = (pbVar15->m_angularComponentA).m_floats[2];
          uVar3 = *(undefined8 *)(pbVar15->m_angularComponentA).m_floats;
          *(ulong *)pbVar12[iVar9].m_deltaAngularVelocity.m_floats =
               CONCAT44((float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar7 >> 0x20) * fVar21 +
                        (float)((ulong)uVar6 >> 0x20),
                        (float)uVar3 * (float)uVar7 * fVar21 + (float)uVar6);
          pbVar12[iVar9].m_deltaAngularVelocity.m_floats[2] =
               fVar22 * fVar21 * fVar1 + pbVar12[iVar9].m_deltaAngularVelocity.m_floats[2];
        }
        pbVar17 = pbVar12[iVar10].m_originalBody;
        if (pbVar17 != (btRigidBody *)0x0) {
          fVar22 = (pbVar15->m_contactNormal2).m_floats[2];
          fVar1 = pbVar12[iVar10].m_invMass.m_floats[2];
          fVar2 = pbVar12[iVar10].m_linearFactor.m_floats[2];
          uVar3 = *(undefined8 *)(pbVar15->m_contactNormal2).m_floats;
          uVar4 = *(undefined8 *)pbVar12[iVar10].m_invMass.m_floats;
          uVar5 = *(undefined8 *)pbVar12[iVar10].m_deltaLinearVelocity.m_floats;
          uVar6 = *(undefined8 *)pbVar12[iVar10].m_deltaAngularVelocity.m_floats;
          uVar7 = *(undefined8 *)pbVar12[iVar10].m_angularFactor.m_floats;
          uVar8 = *(undefined8 *)pbVar12[iVar10].m_linearFactor.m_floats;
          *(ulong *)pbVar12[iVar10].m_deltaLinearVelocity.m_floats =
               CONCAT44((float)((ulong)uVar8 >> 0x20) *
                        (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar3 >> 0x20) * fVar21 +
                        (float)((ulong)uVar5 >> 0x20),
                        (float)uVar8 * (float)uVar4 * (float)uVar3 * fVar21 + (float)uVar5);
          pbVar12[iVar10].m_deltaLinearVelocity.m_floats[2] =
               fVar22 * fVar1 * fVar21 * fVar2 + pbVar12[iVar10].m_deltaLinearVelocity.m_floats[2];
          fVar22 = pbVar12[iVar10].m_angularFactor.m_floats[2];
          fVar1 = (pbVar15->m_angularComponentB).m_floats[2];
          uVar3 = *(undefined8 *)(pbVar15->m_angularComponentB).m_floats;
          *(ulong *)pbVar12[iVar10].m_deltaAngularVelocity.m_floats =
               CONCAT44((float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar7 >> 0x20) * fVar21 +
                        (float)((ulong)uVar6 >> 0x20),
                        (float)uVar3 * (float)uVar7 * fVar21 + (float)uVar6);
          pbVar12[iVar10].m_deltaAngularVelocity.m_floats[2] =
               fVar21 * fVar22 * fVar1 + pbVar12[iVar10].m_deltaAngularVelocity.m_floats[2];
        }
        if (iVar18 != 0) {
          fVar22 = pfVar14[lVar20] - pbVar15->m_appliedPushImpulse;
          if (pbVar16 != (btRigidBody *)0x0) {
            fVar21 = (pbVar15->m_contactNormal1).m_floats[2];
            fVar1 = pbVar12[iVar9].m_invMass.m_floats[2];
            fVar2 = pbVar12[iVar9].m_linearFactor.m_floats[2];
            uVar3 = *(undefined8 *)(pbVar15->m_contactNormal1).m_floats;
            uVar4 = *(undefined8 *)pbVar12[iVar9].m_angularFactor.m_floats;
            uVar5 = *(undefined8 *)pbVar12[iVar9].m_linearFactor.m_floats;
            uVar6 = *(undefined8 *)pbVar12[iVar9].m_invMass.m_floats;
            uVar7 = *(undefined8 *)pbVar12[iVar9].m_pushVelocity.m_floats;
            *(ulong *)pbVar12[iVar9].m_pushVelocity.m_floats =
                 CONCAT44((float)((ulong)uVar6 >> 0x20) * (float)((ulong)uVar3 >> 0x20) * fVar22 *
                          (float)((ulong)uVar5 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                          (float)uVar6 * (float)uVar3 * fVar22 * (float)uVar5 + (float)uVar7);
            pbVar12[iVar9].m_pushVelocity.m_floats[2] =
                 fVar21 * fVar1 * fVar22 * fVar2 + pbVar12[iVar9].m_pushVelocity.m_floats[2];
            fVar21 = pbVar12[iVar9].m_angularFactor.m_floats[2];
            fVar1 = (pbVar15->m_angularComponentA).m_floats[2];
            uVar3 = *(undefined8 *)(pbVar15->m_angularComponentA).m_floats;
            uVar5 = *(undefined8 *)pbVar12[iVar9].m_turnVelocity.m_floats;
            *(ulong *)pbVar12[iVar9].m_turnVelocity.m_floats =
                 CONCAT44((float)((ulong)uVar5 >> 0x20) +
                          (float)((ulong)uVar3 >> 0x20) * fVar22 * (float)((ulong)uVar4 >> 0x20),
                          (float)uVar5 + (float)uVar3 * fVar22 * (float)uVar4);
            pbVar12[iVar9].m_turnVelocity.m_floats[2] =
                 fVar21 * fVar22 * fVar1 + pbVar12[iVar9].m_turnVelocity.m_floats[2];
          }
          if (pbVar17 != (btRigidBody *)0x0) {
            fVar21 = (pbVar15->m_contactNormal2).m_floats[2];
            fVar1 = pbVar12[iVar10].m_invMass.m_floats[2];
            fVar2 = pbVar12[iVar10].m_linearFactor.m_floats[2];
            uVar3 = *(undefined8 *)(pbVar15->m_contactNormal2).m_floats;
            uVar4 = *(undefined8 *)pbVar12[iVar10].m_angularFactor.m_floats;
            uVar5 = *(undefined8 *)pbVar12[iVar10].m_linearFactor.m_floats;
            uVar6 = *(undefined8 *)pbVar12[iVar10].m_invMass.m_floats;
            uVar7 = *(undefined8 *)pbVar12[iVar10].m_pushVelocity.m_floats;
            *(ulong *)pbVar12[iVar10].m_pushVelocity.m_floats =
                 CONCAT44((float)((ulong)uVar6 >> 0x20) * (float)((ulong)uVar3 >> 0x20) * fVar22 *
                          (float)((ulong)uVar5 >> 0x20) + (float)((ulong)uVar7 >> 0x20),
                          (float)uVar6 * (float)uVar3 * fVar22 * (float)uVar5 + (float)uVar7);
            pbVar12[iVar10].m_pushVelocity.m_floats[2] =
                 fVar21 * fVar1 * fVar22 * fVar2 + pbVar12[iVar10].m_pushVelocity.m_floats[2];
            fVar21 = pbVar12[iVar10].m_angularFactor.m_floats[2];
            fVar1 = (pbVar15->m_angularComponentB).m_floats[2];
            uVar3 = *(undefined8 *)(pbVar15->m_angularComponentB).m_floats;
            uVar5 = *(undefined8 *)pbVar12[iVar10].m_turnVelocity.m_floats;
            *(ulong *)pbVar12[iVar10].m_turnVelocity.m_floats =
                 CONCAT44((float)((ulong)uVar5 >> 0x20) +
                          (float)((ulong)uVar3 >> 0x20) * fVar22 * (float)((ulong)uVar4 >> 0x20),
                          (float)uVar5 + (float)uVar3 * fVar22 * (float)uVar4);
            pbVar12[iVar10].m_turnVelocity.m_floats[2] =
                 fVar22 * fVar21 * fVar1 + pbVar12[iVar10].m_turnVelocity.m_floats[2];
          }
          pbVar15->m_appliedPushImpulse = pfVar14[lVar20];
        }
        lVar20 = lVar20 + 1;
      } while (lVar19 != lVar20);
    }
    CProfileManager::Stop_Profile();
  }
  return 0.0;
}

Assistant:

btScalar btMLCPSolver::solveGroupCacheFriendlyIterations(btCollisionObject** bodies ,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	bool result = true;
	{
		BT_PROFILE("solveMLCP");
//		printf("m_A(%d,%d)\n", m_A.rows(),m_A.cols());
		result = solveMLCP(infoGlobal);
	}

	//check if solution is valid, and otherwise fallback to btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations
	if (result)
	{
		BT_PROFILE("process MLCP results");
		for (int i=0;i<m_allConstraintPtrArray.size();i++)
		{
			{
				btSolverConstraint& c = *m_allConstraintPtrArray[i];
				int sbA = c.m_solverBodyIdA;
				int sbB = c.m_solverBodyIdB;
				//btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

				btSolverBody& solverBodyA = m_tmpSolverBodyPool[sbA];
				btSolverBody& solverBodyB = m_tmpSolverBodyPool[sbB];
 
				{
					btScalar deltaImpulse = m_x[i]-c.m_appliedImpulse;
					c.m_appliedImpulse = m_x[i];
					solverBodyA.internalApplyImpulse(c.m_contactNormal1*solverBodyA.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
					solverBodyB.internalApplyImpulse(c.m_contactNormal2*solverBodyB.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
				}

				if (infoGlobal.m_splitImpulse)
				{
					btScalar deltaImpulse = m_xSplit[i] - c.m_appliedPushImpulse;
					solverBodyA.internalApplyPushImpulse(c.m_contactNormal1*solverBodyA.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
					solverBodyB.internalApplyPushImpulse(c.m_contactNormal2*solverBodyB.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
					c.m_appliedPushImpulse = m_xSplit[i];
				}
				
			}
		}
	}
	else
	{
	//	printf("m_fallback = %d\n",m_fallback);
		m_fallback++;
		btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations(bodies ,numBodies,manifoldPtr, numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
	}

	return 0.f;
}